

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O2

void __thiscall
gl4cts::DirectStateAccess::VertexArrays::AttributeBindingDivisorTest::Draw
          (AttributeBindingDivisorTest *this,GLuint number_of_points,GLuint number_of_instances)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  long lVar3;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 0x30))(0);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glBeginTransformFeedback call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0xd08);
  (**(code **)(lVar3 + 0x548))(0,0,number_of_points,number_of_instances);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glDrawArraysInstanced call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0xd0c);
  (**(code **)(lVar3 + 0x638))();
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glEndTransformFeedback call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0xd10);
  return;
}

Assistant:

void AttributeBindingDivisorTest::Draw(glw::GLuint number_of_points, glw::GLuint number_of_instances)
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Setup state. */
	gl.beginTransformFeedback(GL_POINTS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback call failed.");

	/* Draw. */
	gl.drawArraysInstanced(GL_POINTS, 0, number_of_points, number_of_instances);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArraysInstanced call failed.");

	/* State reset. */
	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback call failed.");
}